

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall Units_addUnitsVariations_Test::TestBody(Units_addUnitsVariations_Test *this)

{
  StandardUnit SVar1;
  element_type *peVar2;
  char *pcVar3;
  unsigned_long local_50;
  unsigned_long local_48;
  AssertionResult gtest_ar;
  UnitsPtr u;
  
  libcellml::Units::create();
  peVar2 = u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"compound_unit",(allocator<char> *)&local_50);
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string((string *)&gtest_ar);
  SVar1 = (StandardUnit)u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"",(allocator<char> *)&local_50);
  libcellml::Units::addUnit(SVar1,YOTTA,1.0,1.0,(string *)0xd);
  std::__cxx11::string::~string((string *)&gtest_ar);
  pcVar3 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"",(allocator<char> *)&local_50);
  libcellml::Units::addUnit
            ((StandardUnit)u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             ,0xc,2.0,5.5,(string *)0xfffffffffffffffd);
  std::__cxx11::string::~string((string *)&gtest_ar);
  local_50 = 2;
  local_48 = libcellml::Units::unitCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"size_t(2)","u->unitCount()",&local_50,&local_48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x70,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Units, addUnitsVariations)
{
    libcellml::UnitsPtr u = libcellml::Units::create();
    u->setName("compound_unit");

    u->addUnit(libcellml::Units::StandardUnit::AMPERE, libcellml::Units::Prefix::MICRO);
    u->addUnit(libcellml::Units::StandardUnit::KELVIN, -3, 2.0, 5.5);

    EXPECT_EQ(size_t(2), u->unitCount());
}